

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::beta_dist<float>::cdf(beta_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 x_00;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if (0.0 < in_XMM0_Da) {
    if (in_XMM0_Da < 1.0) {
      x_00 = param_type::alpha(in_RDI);
      param_type::beta(in_RDI);
      param_type::norm(in_RDI);
      local_4 = math::Beta_I(x_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                             in_stack_ffffffffffffffc8);
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      if (x >= 1)
        return 1;
      return math::Beta_I(x, P.alpha(), P.beta(), P.norm());
    }